

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsVersion.cpp
# Opt level: O1

string * getCPUModel_abi_cxx11_(void)

{
  _Alloc_hider _Var1;
  char cVar2;
  istream *piVar3;
  size_type sVar4;
  void *pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ulong uVar6;
  string info;
  string line;
  ifstream cpufile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream((istream *)local_238,"/proc/cpuinfo",_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_278._M_string_length = 0;
    local_278.field_2._M_local_buf[0] = '\0';
    local_258._M_string_length = 0;
    local_258.field_2._M_local_buf[0] = '\0';
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    do {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_258,cVar2);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) goto LAB_00385dcb;
      sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find(&local_258,"model name",0,10);
    } while (sVar4 == 0xffffffffffffffff);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_278,local_258._M_dataplus._M_p,local_258._M_string_length);
LAB_00385dcb:
    std::ifstream::close();
    sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find(&local_278,"model name",0,10);
    _Var1._M_p = local_278._M_dataplus._M_p;
    if (sVar4 == 0xffffffffffffffff) {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      in_RDI->_M_string_length = 0;
      (in_RDI->field_2)._M_local_buf[0] = '\0';
    }
    else {
      uVar6 = 0xffffffffffffffff;
      if (sVar4 <= local_278._M_string_length && local_278._M_string_length - sVar4 != 0) {
        pvVar5 = memchr(local_278._M_dataplus._M_p + sVar4,0x3a,local_278._M_string_length - sVar4);
        uVar6 = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)_Var1._M_p;
      }
      sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_of(&local_278,"\n\r",sVar4,2);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_RDI,&local_278,uVar6 + 1,~uVar6 + sVar4);
      if ((in_RDI->_M_dataplus)._M_p[in_RDI->_M_string_length - 1] == '\0') {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        pop_back(in_RDI);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                               local_258.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,
                      CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                               local_278.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  std::ifstream::~ifstream(local_238);
  return (string *)in_RDI;
}

Assistant:

inline std::string getCPUModel()
{  // Get the cpu from /proc/cpuinfo
    std::ifstream cpufile("/proc/cpuinfo");
    if (!cpufile) {
        return std::string{};
    }
    std::string info;
    std::string line;
    while (getline(cpufile, line)) {
        if (line.find("model name") != std::string::npos) {
            info.append(line);
            break;
        }
    }
    cpufile.close();
    auto modelLoc = info.find("model name");

    if (modelLoc != std::string::npos) {
        auto cloc = info.find_first_of(':', modelLoc);
        auto eline = info.find_first_of("\n\r\0", modelLoc);
        auto modelString = info.substr(cloc + 1, eline - cloc - 1);
        if (modelString.back() == '\0') {
            modelString.pop_back();
        }
        return modelString;
    }
    return std::string{};
}